

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

void registerExpressionFunctions(ExpressionFunctionHandler *handler)

{
  char *pcVar1;
  ExpressionFunctionEntry (*paEVar2) [31];
  allocator<char> local_e9;
  string local_e8;
  Identifier local_c8;
  ExpressionLabelFunctionEntry *local_a8;
  ExpressionLabelFunctionEntry *func_1;
  ExpressionLabelFunctionEntry *__end1_1;
  ExpressionLabelFunctionEntry *__begin1_1;
  ExpressionLabelFunctionEntry (*__range1_1) [4];
  allocator<char> local_71;
  string local_70;
  Identifier local_50;
  ExpressionFunctionEntry *local_30;
  ExpressionFunctionEntry *func;
  ExpressionFunctionEntry *__end1;
  ExpressionFunctionEntry *__begin1;
  ExpressionFunctionEntry (*__range1) [31];
  ExpressionFunctionHandler *handler_local;
  
  __begin1 = expressionFunctions;
  func = (ExpressionFunctionEntry *)&DAT_002a5288;
  __range1 = (ExpressionFunctionEntry (*) [31])handler;
  for (__end1 = expressionFunctions; paEVar2 = __range1, __end1 != func; __end1 = __end1 + 1) {
    local_30 = __end1;
    pcVar1 = __end1->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar1,&local_71);
    Identifier::Identifier(&local_50,&local_70);
    ExpressionFunctionHandler::addFunction
              ((ExpressionFunctionHandler *)paEVar2,&local_50,local_30->function,local_30->minParams
               ,local_30->maxParams,local_30->safety);
    Identifier::~Identifier(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  __begin1_1 = expressionLabelFunctions;
  func_1 = (ExpressionLabelFunctionEntry *)
           &std::
            _Sp_counted_ptr_inplace<std::__detail::_NFA<std::__cxx11::regex_traits<char>>,std::allocator<std::__detail::_NFA<std::__cxx11::regex_traits<char>>>,(__gnu_cxx::_Lock_policy)2>
            ::vtable;
  for (__end1_1 = expressionLabelFunctions; paEVar2 = __range1, __end1_1 != func_1;
      __end1_1 = __end1_1 + 1) {
    local_a8 = __end1_1;
    pcVar1 = __end1_1->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar1,&local_e9);
    Identifier::Identifier(&local_c8,&local_e8);
    ExpressionFunctionHandler::addLabelFunction
              ((ExpressionFunctionHandler *)paEVar2,&local_c8,local_a8->function,local_a8->minParams
               ,local_a8->maxParams,local_a8->safety);
    Identifier::~Identifier(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  return;
}

Assistant:

void registerExpressionFunctions(ExpressionFunctionHandler &handler)
{
	for (const auto &func : expressionFunctions)
	{
		handler.addFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}

	for (const auto &func : expressionLabelFunctions)
	{
		handler.addLabelFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}
}